

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

void Acb_ObjToGiaDual(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,Vec_Int_t *vCopies,
                     int *pRes)

{
  undefined8 uVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  
  iVar2 = Acb_ObjIsCio(p,iObj);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x105,
                  "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                 );
  }
  vTemp->nSize = 0;
  piVar4 = Acb_ObjFanins(p,iObj);
  for (lVar6 = 0; lVar6 < *piVar4; lVar6 = lVar6 + 1) {
    piVar5 = Vec_IntEntryP(vCopies,piVar4[lVar6 + 1] * 2);
    if ((*piVar5 < 0) || (iVar2 = piVar5[1], iVar2 < 0)) {
      __assert_fail("pLits[0] >= 0 && pLits[1] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                    ,0x10a,
                    "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                   );
    }
    Vec_IntPush(vTemp,*piVar5);
    Vec_IntPush(vTemp,iVar2);
  }
  AVar3 = Acb_ObjType(p,iObj);
  switch(AVar3 & 0xff) {
  case ABC_OPER_CONST_F:
    pRes[0] = 0;
    pRes[1] = 0;
    break;
  case ABC_OPER_CONST_T:
    pRes[0] = 1;
    pRes[1] = 0;
    break;
  case ABC_OPER_CONST_X:
    pRes[0] = 0;
    pRes[1] = 1;
    break;
  case ABC_OPER_BIT_BUF:
    iVar2 = Vec_IntEntry(vTemp,0);
    *pRes = iVar2;
    iVar2 = Vec_IntEntry(vTemp,1);
    pRes[1] = iVar2;
    break;
  case ABC_OPER_BIT_INV:
    Gia_ManDualNot((Gia_Man_t *)p,vTemp->pArray,pRes);
    return;
  case ABC_OPER_BIT_MUX:
    if (vTemp->nSize == 6) {
      piVar4 = vTemp->pArray;
      uVar1 = *(undefined8 *)piVar4;
      *(undefined8 *)piVar4 = *(undefined8 *)(piVar4 + 4);
      *(undefined8 *)(piVar4 + 4) = uVar1;
      Gia_ManDualMux(pNew,piVar4,piVar4 + 2,piVar4 + 4,pRes);
      return;
    }
    __assert_fail("Vec_IntSize(vTemp) == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x137,
                  "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                 );
  default:
    if ((AVar3 & 0xff) == ABC_OPER_TRI) {
      if (vTemp->nSize == 4) {
        Gia_ManDualDc(pNew,vTemp->pArray,vTemp->pArray + 2,pRes);
        return;
      }
      __assert_fail("Vec_IntSize(vTemp) == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                    ,0x12f,
                    "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                   );
    }
  case ABC_OPER_CONST_Z:
  case ABC_OPER_BIT_AND:
  case ABC_OPER_BIT_NAND:
  case ABC_OPER_BIT_OR:
  case ABC_OPER_BIT_NOR:
  case ABC_OPER_BIT_XOR:
  case ABC_OPER_BIT_NXOR:
  case ABC_OPER_BIT_SHARP:
  case ABC_OPER_BIT_SHARPL:
    if (AVar3 - ABC_OPER_BIT_AND < 2) {
      Gia_ManDualAndN(pNew,vTemp->pArray,vTemp->nSize / 2,pRes);
      if (AVar3 != ABC_OPER_BIT_NAND) {
        return;
      }
    }
    else if (AVar3 - ABC_OPER_BIT_OR < 2) {
      piVar4 = vTemp->pArray;
      for (lVar6 = 0; iVar2 = vTemp->nSize / 2, lVar6 < iVar2; lVar6 = lVar6 + 1) {
        iVar2 = Abc_LitNot(piVar4[lVar6 * 2]);
        piVar4[lVar6 * 2] = iVar2;
      }
      Gia_ManDualAndN(pNew,piVar4,iVar2,pRes);
      if (AVar3 != ABC_OPER_BIT_OR) {
        return;
      }
    }
    else {
      if (1 < AVar3 - ABC_OPER_BIT_XOR) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                      ,0x156,
                      "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                     );
      }
      if (vTemp->nSize != 4) {
        __assert_fail("Vec_IntSize(vTemp) == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                      ,0x150,
                      "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                     );
      }
      Gia_ManDualXor2(pNew,vTemp->pArray,vTemp->pArray + 2,pRes);
      if (AVar3 != ABC_OPER_BIT_NXOR) {
        return;
      }
    }
    iVar2 = Abc_LitNot(*pRes);
    *pRes = iVar2;
  }
  return;
}

Assistant:

void Acb_ObjToGiaDual( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, Vec_Int_t * vCopies, int pRes[2] )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        int * pLits = Vec_IntEntryP( vCopies, 2*iFanin );
        assert( pLits[0] >= 0 && pLits[1] >= 0 );
        Vec_IntPushTwo( vTemp, pLits[0], pLits[1] );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
    {
        pRes[0] = 0;
        pRes[1] = 0;
        return;
    }
    if ( Type == ABC_OPER_CONST_T ) 
    {
        pRes[0] = 1;
        pRes[1] = 0;
        return;
    }
    if ( Type == ABC_OPER_CONST_X ) 
    {
        pRes[0] = 0;
        pRes[1] = 1;
        return;
    }
    if ( Type == ABC_OPER_BIT_BUF ) 
    {
        pRes[0] = Vec_IntEntry(vTemp, 0);
        pRes[1] = Vec_IntEntry(vTemp, 1);
        return;
    }
    if ( Type == ABC_OPER_BIT_INV ) 
    {
        Gia_ManDualNot( pNew, Vec_IntArray(vTemp), pRes );
        return;
    }
    if ( Type == ABC_OPER_TRI ) 
    {
        // in the file inputs are ordered as follows:  _DC \n6_5[9] ( .O(\108 ), .C(\96 ), .D(\107 ));
        // in this code, we expect them as follows: void Gia_ManDualDc( Gia_Man_t * p, int LitC[2], int LitD[2], int LitZ[2] )
        assert( Vec_IntSize(vTemp) == 4 );
        Gia_ManDualDc( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, pRes );
        return;
    }
    if ( Type == ABC_OPER_BIT_MUX ) 
    {
        // in the file inputs are ordered as follows:  _HMUX \U$1 ( .O(\282 ), .I0(1'b1), .I1(\277 ), .S(\281 ));
        // in this code, we expect them as follows: void Gia_ManDualMux( Gia_Man_t * p, int LitC[2], int LitT[2], int LitE[2], int LitZ[2] )
        assert( Vec_IntSize(vTemp) == 6 );
        ABC_SWAP( int, Vec_IntArray(vTemp)[0], Vec_IntArray(vTemp)[4] );
        ABC_SWAP( int, Vec_IntArray(vTemp)[1], Vec_IntArray(vTemp)[5] );
        Gia_ManDualMux( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, Vec_IntArray(vTemp) + 4, pRes );
        return;
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Gia_ManDualAndN( pNew, Vec_IntArray(vTemp), Vec_IntSize(vTemp)/2, pRes );
        if ( Type == ABC_OPER_BIT_NAND )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        int * pArray = Vec_IntArray( vTemp );
        for ( k = 0; k < Vec_IntSize(vTemp)/2; k++ )
            pArray[2*k] = Abc_LitNot( pArray[2*k] );
        Gia_ManDualAndN( pNew, pArray, Vec_IntSize(vTemp)/2, pRes );
        if ( Type == ABC_OPER_BIT_OR )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        assert( Vec_IntSize(vTemp) == 4 );
        Gia_ManDualXor2( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, pRes );
        if ( Type == ABC_OPER_BIT_NXOR )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    assert( 0 );
}